

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockSettingsHandler_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *param_3,char *line)

{
  int *piVar1;
  ImVector<ImGuiDockNodeSettings> *pIVar2;
  int iVar3;
  undefined1 uVar4;
  int iVar5;
  ImGuiDockNodeSettings *pIVar6;
  ImGuiDockNodeSettings *pIVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ImVec2ih *pIVar11;
  int r;
  int x;
  char c;
  int y;
  int local_68;
  uint local_64;
  char local_5d;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ImVec2ih local_38 [4];
  
  local_5d = '\0';
  local_64 = 0;
  local_5c = 0;
  local_68 = 0;
  uStack_40 = 0;
  local_38[0].x = 0;
  local_38[0].y = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0xff;
  pIVar11 = (ImVec2ih *)((long)&uStack_40 + 4);
  for (; (*line == ' ' || (*line == '\t')); line = line + 1) {
  }
  iVar5 = strncmp(line,"DockNode",8);
  if (iVar5 == 0) {
    for (pcVar10 = line + 8; (*pcVar10 == ' ' || (*pcVar10 == '\t')); pcVar10 = pcVar10 + 1) {
    }
  }
  else {
    iVar5 = strncmp(line,"DockSpace",9);
    if (iVar5 != 0) {
      return;
    }
    for (pcVar10 = line + 9; (*pcVar10 == ' ' || (*pcVar10 == '\t')); pcVar10 = pcVar10 + 1) {
    }
    local_48 = local_48 | 0x40000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10,"ID=0x%08X%n",&local_58,&local_68);
  if (iVar5 != 1) {
    return;
  }
  pcVar10 = pcVar10 + local_68;
  iVar5 = __isoc99_sscanf(pcVar10," Parent=0x%08X%n",(long)&local_58 + 4);
  if (iVar5 == 1) {
    if (local_58._4_4_ == 0) {
      return;
    }
    pcVar10 = pcVar10 + local_68;
  }
  iVar5 = __isoc99_sscanf(pcVar10," Window=0x%08X%n",&uStack_50,&local_68);
  if (iVar5 == 1) {
    if ((int)uStack_50 == 0) {
      return;
    }
    pcVar10 = pcVar10 + local_68;
  }
  if (local_58._4_4_ == 0) {
    iVar5 = __isoc99_sscanf(pcVar10," Pos=%i,%i%n",&local_64,&local_5c,&local_68);
    if (iVar5 != 2) {
      return;
    }
    lVar9 = (long)local_68;
    uStack_40 = CONCAT44(uStack_40._4_4_,local_5c << 0x10 | local_64 & 0xffff);
    iVar5 = __isoc99_sscanf(pcVar10 + lVar9," Size=%i,%i%n");
    if (iVar5 != 2) {
      return;
    }
    pcVar10 = pcVar10 + lVar9 + local_68;
LAB_0013feab:
    *pIVar11 = (ImVec2ih)(local_5c << 0x10 | local_64 & 0xffff);
  }
  else {
    iVar5 = __isoc99_sscanf(pcVar10," SizeRef=%i,%i%n",&local_64,&local_5c,&local_68);
    if (iVar5 == 2) {
      pcVar10 = pcVar10 + local_68;
      pIVar11 = local_38;
      goto LAB_0013feab;
    }
  }
  iVar5 = __isoc99_sscanf(pcVar10," Split=%c%n",&local_5d,&local_68);
  if (iVar5 == 1) {
    pcVar10 = pcVar10 + local_68;
    if (local_5d == 'X') {
      uVar4 = 0;
    }
    else {
      if (local_5d != 'Y') goto LAB_0013fefa;
      uVar4 = 1;
    }
    local_48 = CONCAT71(local_48._1_7_,uVar4);
  }
LAB_0013fefa:
  iVar5 = __isoc99_sscanf(pcVar10," NoResize=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x2000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10," CentralNode=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x80000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10," NoTabBar=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x100000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10," HiddenTabBar=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x200000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10," NoWindowMenuButton=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x400000000000;
  }
  iVar5 = __isoc99_sscanf(pcVar10," NoCloseButton=%d%n",&local_64,&local_68);
  if ((iVar5 == 1) && (pcVar10 = pcVar10 + local_68, local_64 != 0)) {
    local_48 = local_48 | 0x800000000000;
  }
  __isoc99_sscanf(pcVar10," Selected=0x%08X%n",(long)&uStack_50 + 4,&local_68);
  if (local_58._4_4_ != 0) {
    lVar9 = (long)(ctx->DockContext).NodesSettings.Size;
    if (0 < lVar9) {
      pIVar6 = (ctx->DockContext).NodesSettings.Data;
      do {
        if (pIVar6->ID == local_58._4_4_) goto LAB_00140066;
        pIVar6 = pIVar6 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pIVar6 = (ImGuiDockNodeSettings *)0x0;
LAB_00140066:
    if (pIVar6 != (ImGuiDockNodeSettings *)0x0) {
      local_48._0_2_ = CONCAT11(pIVar6->Depth + '\x01',(undefined1)local_48);
    }
  }
  iVar5 = (ctx->DockContext).NodesSettings.Size;
  iVar3 = (ctx->DockContext).NodesSettings.Capacity;
  if (iVar5 == iVar3) {
    iVar5 = iVar5 + 1;
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    if (iVar3 < iVar5) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiDockNodeSettings *)
               (*GImAllocatorAllocFunc)((long)iVar5 * 0x24,GImAllocatorUserData);
      pIVar6 = (ctx->DockContext).NodesSettings.Data;
      if (pIVar6 != (ImGuiDockNodeSettings *)0x0) {
        memcpy(pIVar7,pIVar6,(long)(ctx->DockContext).NodesSettings.Size * 0x24);
        pIVar6 = (ctx->DockContext).NodesSettings.Data;
        if ((pIVar6 != (ImGuiDockNodeSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (ctx->DockContext).NodesSettings.Data = pIVar7;
      (ctx->DockContext).NodesSettings.Capacity = iVar5;
    }
  }
  pIVar6 = (ctx->DockContext).NodesSettings.Data;
  iVar5 = (ctx->DockContext).NodesSettings.Size;
  pIVar6[iVar5].SizeRef = local_38[0];
  pIVar7 = pIVar6 + iVar5;
  pIVar7->SplitAxis = (undefined1)local_48;
  pIVar7->Depth = local_48._1_1_;
  *(undefined2 *)&pIVar7->field_0x12 = local_48._2_2_;
  pIVar7->Flags = local_48._4_4_;
  *(undefined8 *)(&pIVar7->SplitAxis + 8) = uStack_40;
  pIVar6 = pIVar6 + iVar5;
  pIVar6->ID = (undefined4)local_58;
  pIVar6->ParentNodeId = local_58._4_4_;
  pIVar6->ParentWindowId = (int)uStack_50;
  pIVar6->SelectedTabId = uStack_50._4_4_;
  pIVar2 = &(ctx->DockContext).NodesSettings;
  pIVar2->Size = pIVar2->Size + 1;
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void*, const char* line)
{
    char c = 0;
    int x = 0, y = 0;
    int r = 0;

    // Parsing, e.g.
    // " DockNode   ID=0x00000001 Pos=383,193 Size=201,322 Split=Y,0.506 "
    // "   DockNode ID=0x00000002 Parent=0x00000001 "
    // Important: this code expect currently fields in a fixed order.
    ImGuiDockNodeSettings node;
    line = ImStrSkipBlank(line);
    if      (strncmp(line, "DockNode", 8) == 0)  { line = ImStrSkipBlank(line + strlen("DockNode")); }
    else if (strncmp(line, "DockSpace", 9) == 0) { line = ImStrSkipBlank(line + strlen("DockSpace")); node.Flags |= ImGuiDockNodeFlags_DockSpace; }
    else return;
    if (sscanf(line, "ID=0x%08X%n",      &node.ID, &r) == 1)            { line += r; } else return;
    if (sscanf(line, " Parent=0x%08X%n", &node.ParentNodeId, &r) == 1)  { line += r; if (node.ParentNodeId == 0) return; }
    if (sscanf(line, " Window=0x%08X%n", &node.ParentWindowId, &r) ==1) { line += r; if (node.ParentWindowId == 0) return; }
    if (node.ParentNodeId == 0)
    {
        if (sscanf(line, " Pos=%i,%i%n",  &x, &y, &r) == 2)         { line += r; node.Pos = ImVec2ih((short)x, (short)y); } else return;
        if (sscanf(line, " Size=%i,%i%n", &x, &y, &r) == 2)         { line += r; node.Size = ImVec2ih((short)x, (short)y); } else return;
    }
    else
    {
        if (sscanf(line, " SizeRef=%i,%i%n", &x, &y, &r) == 2)      { line += r; node.SizeRef = ImVec2ih((short)x, (short)y); }
    }
    if (sscanf(line, " Split=%c%n", &c, &r) == 1)                   { line += r; if (c == 'X') node.SplitAxis = ImGuiAxis_X; else if (c == 'Y') node.SplitAxis = ImGuiAxis_Y; }
    if (sscanf(line, " NoResize=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoResize; }
    if (sscanf(line, " CentralNode=%d%n", &x, &r) == 1)             { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_CentralNode; }
    if (sscanf(line, " NoTabBar=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoTabBar; }
    if (sscanf(line, " HiddenTabBar=%d%n", &x, &r) == 1)            { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_HiddenTabBar; }
    if (sscanf(line, " NoWindowMenuButton=%d%n", &x, &r) == 1)      { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoWindowMenuButton; }
    if (sscanf(line, " NoCloseButton=%d%n", &x, &r) == 1)           { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoCloseButton; }
    if (sscanf(line, " Selected=0x%08X%n", &node.SelectedTabId,&r) == 1) { line += r; }
    if (node.ParentNodeId != 0)
        if (ImGuiDockNodeSettings* parent_settings = DockSettingsFindNodeSettings(ctx, node.ParentNodeId))
            node.Depth = parent_settings->Depth + 1;
    ctx->DockContext.NodesSettings.push_back(node);
}